

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

double ON_MeshParameters::MeshDensityAsPercentage(double normalized_mesh_density)

{
  double dVar1;
  double dVar2;
  double p;
  double n;
  double slider_percent;
  double percent_fuzz_tol;
  double normalized_mesh_density_local;
  
  if ((normalized_mesh_density < 0.0) || (1.0 < normalized_mesh_density)) {
    normalized_mesh_density_local = ON_DBL_QNAN;
  }
  else {
    dVar1 = normalized_mesh_density * 100.0;
    normalized_mesh_density_local = floor(dVar1 + 0.25);
    if (0.0001 < ABS(normalized_mesh_density_local - dVar1)) {
      dVar2 = floor(normalized_mesh_density * 1024.0 + 0.25);
      dVar2 = (dVar2 / 1024.0) * 100.0;
      normalized_mesh_density_local = dVar1;
      if (ABS(dVar2 - dVar1) <= 0.0001) {
        normalized_mesh_density_local = dVar2;
      }
    }
  }
  return normalized_mesh_density_local;
}

Assistant:

double ON_MeshParameters::MeshDensityAsPercentage(double normalized_mesh_density)
{
  if (normalized_mesh_density >= 0.0 && normalized_mesh_density <= 1.0)
  {
    const double percent_fuzz_tol = 1.0e-4;
    const double slider_percent = normalized_mesh_density * 100.0; // percent = slider_value as a percentage.
    const double n = floor(slider_percent + 0.25);
    if (fabs(n - slider_percent) <= percent_fuzz_tol)
      return n; // slider_percent is within fuzz of being an integer - return the integer

    const double p = 100.0*(floor(1024.0 * normalized_mesh_density + 0.25) / 1024.0);
    if (fabs(p - slider_percent) <= percent_fuzz_tol)
      return p; // slider_percent is within fuzz of 100.0*(N/1024.0). Return 100.0*(N/1024.0).

    return slider_percent; // return percentage with no fuzz removal
  }
  return ON_DBL_QNAN; // not a percent
}